

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *enumNode)

{
  ListElementCount LVar1;
  bool *__s;
  ulong uVar2;
  ElementCount index;
  bool bVar3;
  bool _kjCondition;
  uint7 uStack_137;
  ulong local_130;
  undefined8 *local_128;
  bool *local_120;
  undefined1 local_118 [16];
  Fault f;
  Array<bool> sawCodeOrder_heap;
  Reader enumerant;
  ArrayPtr<const_char> local_a8;
  undefined8 local_98;
  int local_90;
  Reader enumerants;
  bool sawCodeOrder_stack [32];
  
  bVar3 = (enumNode->_reader).pointerCount < 4;
  enumerant._reader.data = (enumNode->_reader).pointers + 3;
  if (bVar3) {
    enumerant._reader.data = (WirePointer *)0x0;
  }
  enumerant._reader.pointers._0_4_ = (enumNode->_reader).nestingLimit;
  if (bVar3) {
    enumerant._reader.segment._0_4_ = 0;
    enumerant._reader.segment._4_4_ = 0;
    enumerant._reader.capTable._0_4_ = 0;
    enumerant._reader.capTable._4_4_ = 0;
    enumerant._reader.pointers._0_4_ = 0x7fffffff;
  }
  else {
    enumerant._reader.segment._0_4_ = *(undefined4 *)&(enumNode->_reader).segment;
    enumerant._reader.segment._4_4_ = *(undefined4 *)((long)&(enumNode->_reader).segment + 4);
    enumerant._reader.capTable._0_4_ = *(undefined4 *)&(enumNode->_reader).capTable;
    enumerant._reader.capTable._4_4_ = *(undefined4 *)((long)&(enumNode->_reader).capTable + 4);
  }
  capnp::_::PointerReader::getList
            (&enumerants.reader,(PointerReader *)&enumerant,INLINE_COMPOSITE,(word *)0x0);
  uVar2 = (ulong)enumerants.reader.elementCount;
  if (uVar2 < 0x21) {
    __s = sawCodeOrder_stack;
    local_128 = (undefined8 *)0x0;
    local_130 = 0;
    local_120 = (bool *)0x0;
  }
  else {
    __s = (bool *)kj::_::HeapArrayDisposer::allocateImpl
                            (1,uVar2,uVar2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_128 = &kj::_::HeapArrayDisposer::instance;
    local_130 = uVar2;
    local_120 = __s;
  }
  memset(__s,0,uVar2);
  LVar1 = enumerants.reader.elementCount;
  if (enumerants.reader.elementCount != 0) {
    index = 0;
    do {
      capnp::_::ListReader::getStructElement(&enumerant._reader,&enumerants.reader,index);
      local_90 = enumerant._reader.nestingLimit;
      local_98._4_4_ = enumerant._reader.pointers._4_4_;
      local_98._0_4_ = (int)enumerant._reader.pointers;
      if (enumerant._reader.pointerCount == 0) {
        local_98._0_4_ = 0;
        local_98._4_4_ = 0;
        local_90 = 0x7fffffff;
      }
      local_a8.ptr._0_4_ = 0;
      local_a8.ptr._4_4_ = 0;
      local_a8.size_._0_4_ = 0;
      local_a8.size_._4_4_ = 0;
      if (enumerant._reader.pointerCount != 0) {
        local_a8.ptr._0_4_ = enumerant._reader.segment._0_4_;
        local_a8.ptr._4_4_ = enumerant._reader.segment._4_4_;
        local_a8.size_._0_4_ = enumerant._reader.capTable._0_4_;
        local_a8.size_._4_4_ = enumerant._reader.capTable._4_4_;
      }
      local_118 = (undefined1  [16])
                  capnp::_::PointerReader::getBlob<capnp::Text>
                            ((PointerReader *)&local_a8,(void *)0x0,0);
      f.exception = (Exception *)local_118;
      local_98 = (WirePointer *)CONCAT44(local_98._4_4_,index);
      __kjCondition = (anon_class_16_2_3f8e8a0c *)&f;
      local_a8 = (ArrayPtr<const_char>)local_118;
      kj::
      Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
      ::
      upsert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::upsert<capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_>(capnp::Text::Reader,unsigned_int,capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&,kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&&)_1_>
                ((Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
                  *)&this->members,(Entry *)&local_a8,(anon_class_8_1_6f242a07 *)&_kjCondition);
      if (0xf < enumerant._reader.dataSize) {
        if (*enumerant._reader.data < enumerants.reader.elementCount) {
          __kjCondition =
               (anon_class_16_2_3f8e8a0c *)(CONCAT71(uStack_137,__s[*enumerant._reader.data]) ^ 1);
          if (__s[*enumerant._reader.data] == false) {
            uVar2 = (ulong)*enumerant._reader.data;
            goto LAB_001aaa5c;
          }
        }
        else {
LAB_001aaa72:
          __kjCondition = (anon_class_16_2_3f8e8a0c *)((ulong)uStack_137 << 8);
        }
LAB_001aaa76:
        bVar3 = enumerant._reader.pointerCount == 0;
        local_98 = (WirePointer *)
                   CONCAT44(enumerant._reader.pointers._4_4_,(int)enumerant._reader.pointers);
        if (bVar3) {
          local_98 = (WirePointer *)0x0;
        }
        local_90 = 0x7fffffff;
        if (!bVar3) {
          local_90 = enumerant._reader.nestingLimit;
        }
        local_a8.ptr._0_4_ = 0;
        local_a8.ptr._4_4_ = 0;
        local_a8.size_._0_4_ = 0;
        local_a8.size_._4_4_ = 0;
        if (!bVar3) {
          local_a8.ptr._0_4_ = enumerant._reader.segment._0_4_;
          local_a8.ptr._4_4_ = enumerant._reader.segment._4_4_;
          local_a8.size_._0_4_ = enumerant._reader.capTable._0_4_;
          local_a8.size_._4_4_ = enumerant._reader.capTable._4_4_;
        }
        local_118 = (undefined1  [16])
                    capnp::_::PointerReader::getBlob<capnp::Text>
                              ((PointerReader *)&local_a8,(void *)0x0,0);
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[18],capnp::Text::Reader>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x1a5,FAILED,
                   "enumerant.getCodeOrder() < enumerants.size() && !sawCodeOrder[enumerant.getCodeOrder()]"
                   ,"_kjCondition,\"invalid codeOrder\", enumerant.getName()",&_kjCondition,
                   (char (*) [18])"invalid codeOrder",(Reader *)local_118);
        this->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
        break;
      }
      if (enumerants.reader.elementCount == 0) goto LAB_001aaa72;
      __kjCondition = (anon_class_16_2_3f8e8a0c *)(CONCAT71(uStack_137,*__s) ^ 1);
      if (*__s != false) goto LAB_001aaa76;
      uVar2 = 0;
LAB_001aaa5c:
      index = index + 1;
      __s[uVar2] = true;
    } while (LVar1 != index);
  }
  if (local_120 != (bool *)0x0) {
    (**(code **)*local_128)(local_128,local_120,1,local_130,local_130,0);
  }
  return;
}

Assistant:

KJ_STACK_ARRAY(bool, sawCodeOrder, enumerants.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    uint index = 0;
    for (auto enumerant: enumerants) {
      validateMemberName(enumerant.getName(), index++);

      VALIDATE_SCHEMA(enumerant.getCodeOrder() < enumerants.size() &&
                      !sawCodeOrder[enumerant.getCodeOrder()],
                      "invalid codeOrder", enumerant.getName());
      sawCodeOrder[enumerant.getCodeOrder()] = true;
    }